

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O2

void * __thiscall
embree::SharedLazyTessellationCache::realloc
          (SharedLazyTessellationCache *this,void *__ptr,size_t __size)

{
  SpinLock *this_00;
  SpinLock *this_01;
  __int_type_conflict _Var1;
  ThreadWorkState *t_state;
  bool bVar2;
  float *pfVar3;
  ulong uVar4;
  long *plVar5;
  SharedLazyTessellationCache *this_02;
  ThreadWorkState **ppTVar6;
  bool local_3a;
  bool local_39;
  void *local_38;
  
  this_00 = &this->reset_state;
  local_38 = __ptr;
  do {
    do {
    } while (((this_00->flag).super_atomic<bool>._M_base._M_i & 1U) != 0);
    local_39 = false;
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)this_00,&local_39,true,memory_order_acquire);
  } while (!bVar2);
  this_01 = &this->linkedlist_mtx;
  do {
    do {
    } while (((this_01->flag).super_atomic<bool>._M_base._M_i & 1U) != 0);
    local_3a = false;
    this_02 = (SharedLazyTessellationCache *)this_01;
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)this_01,&local_3a,true,memory_order_acquire);
  } while (!bVar2);
  ppTVar6 = (ThreadWorkState **)&current_t_state;
  while (t_state = *ppTVar6, t_state != (ThreadWorkState *)0x0) {
    LOCK();
    _Var1 = (t_state->counter).super___atomic_base<unsigned_long>._M_i;
    (t_state->counter).super___atomic_base<unsigned_long>._M_i =
         (t_state->counter).super___atomic_base<unsigned_long>._M_i + 4;
    UNLOCK();
    if (_Var1 != 0) {
      waitForUsersLessEqual(this_02,t_state,4);
    }
    ppTVar6 = &t_state->next;
  }
  if (this->data != (float *)0x0) {
    os_free(this->data,this->size,this->hugepages);
  }
  this->size = (size_t)local_38;
  this->data = (float *)0x0;
  if (local_38 == (void *)0x0) {
    uVar4 = 0;
  }
  else {
    pfVar3 = (float *)os_malloc((size_t)local_38,&this->hugepages);
    this->data = pfVar3;
    uVar4 = this->size >> 6;
  }
  this->maxBlocks = uVar4;
  LOCK();
  (this->localTime).super___atomic_base<unsigned_long>._M_i =
       (this->localTime).super___atomic_base<unsigned_long>._M_i + 8;
  UNLOCK();
  LOCK();
  (this->next_block).super___atomic_base<unsigned_long>._M_i =
       (this->maxBlocks >> 3) *
       (ulong)((uint)(this->localTime).super___atomic_base<unsigned_long>._M_i & 7);
  UNLOCK();
  LOCK();
  (this->switch_block_threshold).super___atomic_base<unsigned_long>._M_i =
       (this->maxBlocks >> 3) + (this->next_block).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  plVar5 = &current_t_state;
  while( true ) {
    plVar5 = (long *)*plVar5;
    if (plVar5 == (long *)0x0) break;
    LOCK();
    *plVar5 = *plVar5 + -4;
    UNLOCK();
    plVar5 = plVar5 + 1;
  }
  (this_01->flag).super_atomic<bool>._M_base._M_i = false;
  (this_00->flag).super_atomic<bool>._M_base._M_i = false;
  return plVar5;
}

Assistant:

void SharedLazyTessellationCache::realloc(const size_t new_size)
  {
    /* lock the reset_state */
    reset_state.lock();

    /* lock the linked list of thread states */
    linkedlist_mtx.lock();

    /* block all threads */
    for (ThreadWorkState *t=current_t_state;t!=nullptr;t=t->next)
      if (lockThread(t,THREAD_BLOCK_ATOMIC_ADD) != 0)
        waitForUsersLessEqual(t,THREAD_BLOCK_ATOMIC_ADD);

    /* reallocate data */
    if (data) os_free(data,size,hugepages);
    size      = new_size;
    data      = nullptr;
    if (size) data = (float*)os_malloc(size,hugepages);
    maxBlocks = size/BLOCK_SIZE;    

    /* invalidate entire cache */
    localTime += NUM_CACHE_SEGMENTS; 

    /* reset to the first segment */
#if FORCE_SIMPLE_FLUSH == 1
    next_block = 0;
    switch_block_threshold = maxBlocks;
#else
    const size_t region = localTime % NUM_CACHE_SEGMENTS;
    next_block = region * (maxBlocks/NUM_CACHE_SEGMENTS);
    switch_block_threshold = next_block + (maxBlocks/NUM_CACHE_SEGMENTS);
    assert( switch_block_threshold <= maxBlocks );
#endif

    /* release all blocked threads */
    for (ThreadWorkState *t=current_t_state;t!=nullptr;t=t->next)
      unlockThread(t,-THREAD_BLOCK_ATOMIC_ADD);

    /* unlock the linked list of thread states */
    linkedlist_mtx.unlock();	    

    /* unlock the reset_state */
    reset_state.unlock();
  }